

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexManager.cpp
# Opt level: O0

void __thiscall IndexManager::InsertSuchKey(IndexManager *this,IndexInfo *I,Addr p,value *v)

{
  BpTree<int> *this_00;
  BpTree<float> *this_01;
  BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_02;
  string local_160 [32];
  string local_140 [32];
  BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_120;
  BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *Tree_2;
  string local_110 [32];
  BpTree<float> *local_f0;
  BpTree<float> *Tree_1;
  string local_e0 [32];
  BpTree<int> *local_c0;
  BpTree<int> *Tree;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [8];
  string filename;
  value *v_local;
  IndexInfo *I_local;
  IndexManager *this_local;
  Addr p_local;
  
  std::operator+(local_a8,&this->Direction);
  std::operator+(local_88,(char *)local_a8);
  std::operator+(local_68,local_88);
  std::operator+(local_48,(char *)local_68);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_a8);
  if (v->type == 50000) {
    std::__cxx11::string::string(local_e0,(string *)local_48);
    this_00 = FindBpTree_I(this,(string *)local_e0);
    std::__cxx11::string::~string(local_e0);
    Tree_1 = (BpTree<float> *)p;
    local_c0 = this_00;
    BpTree<int>::InsertKey(this_00,v->intV,p);
  }
  else if (v->type == 90000) {
    std::__cxx11::string::string(local_110,(string *)local_48);
    this_01 = FindBpTree_F(this,(string *)local_110);
    std::__cxx11::string::~string(local_110);
    Tree_2 = (BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)p;
    local_f0 = this_01;
    BpTree<float>::InsertKey(this_01,v->floatV,p);
  }
  else if (120000 < v->type) {
    std::__cxx11::string::string(local_140,(string *)local_48);
    this_02 = FindBpTree_S(this,(string *)local_140);
    std::__cxx11::string::~string(local_140);
    local_120 = this_02;
    std::__cxx11::string::string(local_160,(string *)&v->charV);
    BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    InsertKey(this_02,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160
              ,p);
    std::__cxx11::string::~string(local_160);
  }
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void IndexManager::InsertSuchKey(IndexInfo I, Addr p, value v) {
	string filename = Direction + I.tableName + "_" + I.indexName + "_idx.dat";
	if (v.type == 50000) {
		BpTree<int>& Tree = FindBpTree_I(filename);
		Tree.InsertKey(v.intV, p);
	}
	else if (v.type == 90000) {
		BpTree<float>& Tree = FindBpTree_F(filename);
		Tree.InsertKey(v.floatV, p);
	}
	else if (v.type > 120000) {
		BpTree<string>& Tree = FindBpTree_S(filename);
		Tree.InsertKey(v.charV, p);
	}
}